

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

int __thiscall QObjectPrivate::signalIndex(QObjectPrivate *this,char *signalName,QMetaObject **meta)

{
  QMetaObject *pQVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  QArgumentType *in_R9;
  long in_FS_OFFSET;
  QByteArrayView name;
  QByteArrayView QVar4;
  QMetaObject *base;
  QArgumentTypeArray types;
  QMetaObject *local_190;
  undefined1 local_188 [344];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (**((this->super_QObjectData).q_ptr)->_vptr_QObject)();
  local_190 = (QMetaObject *)CONCAT44(extraout_var,iVar2);
  memset((QArgumentTypeArray *)local_188,0xaa,0x158);
  local_188._0_8_ = 10;
  local_188._8_8_ = 0;
  local_188._16_8_ = (QArgumentType *)(local_188 + 0x18);
  QVar4 = QMetaObjectPrivate::decodeMethodSignature(signalName,(QArgumentTypeArray *)local_188);
  name.m_size = QVar4.m_data;
  name.m_data._0_4_ = local_188._8_4_;
  name.m_data._4_4_ = 0;
  iVar2 = QMetaObjectPrivate::indexOfSignalRelative
                    ((QMetaObjectPrivate *)&local_190,(QMetaObject **)QVar4.m_size,name,
                     (int)local_188._16_8_,in_R9);
  if (-1 < iVar2) {
    iVar3 = QMetaObjectPrivate::originalClone(local_190,iVar2);
    if (meta != (QMetaObject **)0x0) {
      *meta = local_190;
    }
    iVar2 = 0;
    for (pQVar1 = (local_190->d).superdata.direct; pQVar1 != (QMetaObject *)0x0;
        pQVar1 = (pQVar1->d).superdata.direct) {
      iVar2 = iVar2 + (pQVar1->d).data[0xd];
    }
    iVar2 = iVar2 + iVar3;
  }
  std::_Destroy_n_aux<false>::__destroy_n<QArgumentType*,long_long>
            ((QArgumentType *)local_188._16_8_,local_188._8_8_);
  if ((QArgumentType *)local_188._16_8_ != (QArgumentType *)(local_188 + 0x18)) {
    QtPrivate::sizedFree((void *)local_188._16_8_,local_188._0_8_ << 5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int QObjectPrivate::signalIndex(const char *signalName,
                                const QMetaObject **meta) const
{
    Q_Q(const QObject);
    const QMetaObject *base = q->metaObject();
    Q_ASSERT(QMetaObjectPrivate::get(base)->revision >= 7);
    QArgumentTypeArray types;
    QByteArrayView name = QMetaObjectPrivate::decodeMethodSignature(signalName, types);
    int relative_index = QMetaObjectPrivate::indexOfSignalRelative(
            &base, name, types.size(), types.constData());
    if (relative_index < 0)
        return relative_index;
    relative_index = QMetaObjectPrivate::originalClone(base, relative_index);
    if (meta)
        *meta = base;
    return relative_index + QMetaObjectPrivate::signalOffset(base);
}